

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

getout * new_getout(OperationConfig *config)

{
  int iVar1;
  getout *pgVar2;
  getout *pgVar3;
  
  pgVar2 = (getout *)calloc(1,0x28);
  if (pgVar2 != (getout *)0x0) {
    pgVar3 = (getout *)&config->url_list;
    if (config->url_last != (getout *)0x0) {
      pgVar3 = config->url_last;
    }
    pgVar3->next = pgVar2;
    config->url_last = pgVar2;
    pgVar2->flags = config->default_node_flags;
    iVar1 = new_getout::outnum + 1;
    pgVar2->num = new_getout::outnum;
    new_getout::outnum = iVar1;
  }
  return pgVar2;
}

Assistant:

struct getout *new_getout(struct OperationConfig *config)
{
  struct getout *node = calloc(1, sizeof(struct getout));
  struct getout *last = config->url_last;
  if(node) {
    static int outnum = 0;

    /* append this new node last in the list */
    if(last)
      last->next = node;
    else
      config->url_list = node; /* first node */

    /* move the last pointer */
    config->url_last = node;

    node->flags = config->default_node_flags;
    node->num = outnum++;
  }
  return node;
}